

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_impl.hpp
# Opt level: O2

void __thiscall
xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge::PrintEdge(Edge *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Edge_t: src - ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," , dst - ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," , cost - ");
  poVar1 = std::ostream::_M_insert<double>(this->cost);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::Edge::PrintEdge() {
  std::cout << "Edge_t: src - " << src->GetVertexID() << " , dst - "
            << dst->GetVertexID() << " , cost - " << cost << std::endl;
}